

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool imageExists(string *rootDir,string *imageId)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  long *__s2;
  int iVar4;
  pointer pIVar5;
  pointer pIVar6;
  long lVar7;
  pointer pIVar8;
  undefined1 auVar9 [8];
  undefined1 auVar10 [8];
  undefined1 local_118 [8];
  vector<Image,_std::allocator<Image>_> images;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  size_t local_50;
  long local_48 [2];
  pointer local_38;
  
  getContainerImages((vector<Image,_std::allocator<Image>_> *)local_118,rootDir);
  local_98 = local_88;
  pcVar1 = (imageId->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + imageId->_M_string_length);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_98,local_90 + (long)local_98);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_78,local_70 + (long)local_78);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_b8,local_b0 + (long)local_b8);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_d8,local_d0 + (long)local_d8);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_58,local_50 + (long)local_58);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_f8,local_f0 + (long)local_f8);
  sVar3 = local_50;
  __s2 = local_58;
  local_38 = images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar7 = ((long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)local_118 >> 3) * -0x71c71c71c71c71c7 >> 2
  ;
  auVar10 = local_118;
  if (0 < lVar7) {
    images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((long)local_118 + lVar7 * 4 * 0x48);
    lVar7 = lVar7 + 1;
    pIVar5 = (pointer)((long)local_118 + 0x90);
    auVar9 = local_118;
    do {
      sVar2 = pIVar5[-2].id._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          pIVar6 = pIVar5 + -2;
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
        iVar4 = bcmp(pIVar5[-2].id._M_dataplus._M_p,__s2,sVar2);
        pIVar6 = (pointer)auVar9;
        pIVar8 = local_38;
        if (iVar4 == 0) goto LAB_0010c17b;
      }
      sVar2 = pIVar5[-1].id._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          pIVar6 = (pointer)((long)auVar9 + 0x48);
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
        iVar4 = bcmp(pIVar5[-1].id._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          pIVar6 = pIVar5 + -1;
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
      }
      sVar2 = (pIVar5->id)._M_string_length;
      if (sVar2 == sVar3) {
        pIVar6 = pIVar5;
        pIVar8 = local_38;
        if (sVar2 == 0) goto LAB_0010c17b;
        iVar4 = bcmp((pIVar5->id)._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          pIVar6 = (pointer)((long)auVar9 + 0x90);
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
      }
      sVar2 = pIVar5[1].id._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          pIVar6 = (pointer)((long)auVar9 + 0xd8);
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
        iVar4 = bcmp(pIVar5[1].id._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          pIVar6 = pIVar5 + 1;
          pIVar8 = local_38;
          goto LAB_0010c17b;
        }
      }
      auVar9 = (undefined1  [8])((long)auVar9 + 0x120);
      lVar7 = lVar7 + -1;
      pIVar5 = pIVar5 + 4;
      auVar10 = (undefined1  [8])
                images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    } while (1 < lVar7);
  }
  pIVar8 = local_38;
  lVar7 = ((long)local_38 - (long)auVar10 >> 3) * -0x71c71c71c71c71c7;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pIVar6 = pIVar8;
      if ((lVar7 != 3) ||
         ((sVar3 = (((pointer)auVar10)->id)._M_string_length, sVar3 == local_50 &&
          ((pIVar6 = (pointer)auVar10, sVar3 == 0 ||
           (iVar4 = bcmp((((pointer)auVar10)->id)._M_dataplus._M_p,local_58,sVar3), iVar4 == 0))))))
      goto LAB_0010c17b;
      auVar10 = (undefined1  [8])((long)auVar10 + 0x48);
    }
    sVar3 = (((pointer)auVar10)->id)._M_string_length;
    if ((sVar3 == local_50) &&
       ((pIVar6 = (pointer)auVar10, sVar3 == 0 ||
        (iVar4 = bcmp((((pointer)auVar10)->id)._M_dataplus._M_p,local_58,sVar3), iVar4 == 0))))
    goto LAB_0010c17b;
    auVar10 = (undefined1  [8])((long)auVar10 + 0x48);
  }
  sVar3 = (((pointer)auVar10)->id)._M_string_length;
  pIVar6 = pIVar8;
  if (((sVar3 == local_50) && (pIVar6 = (pointer)auVar10, sVar3 != 0)) &&
     (iVar4 = bcmp((((pointer)auVar10)->id)._M_dataplus._M_p,local_58,sVar3), iVar4 != 0)) {
    pIVar6 = pIVar8;
  }
LAB_0010c17b:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)local_118);
  return pIVar6 != pIVar8;
}

Assistant:

bool imageExists(const std::string& rootDir, const std::string& imageId)
{
    auto images = getContainerImages(rootDir);
    return std::any_of(images.cbegin(), images.cend(),
                       [imageId](const Image& image) { return image.id == imageId; });
}